

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnWidthAutoSingle(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  int in_ESI;
  long in_RDI;
  ImGuiTableColumn *column;
  
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_ESI);
  if ((pIVar1->IsEnabled & 1U) != 0) {
    pIVar1->CannotSkipItemsQueue = '\x01';
    *(char *)(in_RDI + 0x1f6) = (char)in_ESI;
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoSingle(ImGuiTable* table, int column_n)
{
    // Single auto width uses auto-fit
    ImGuiTableColumn* column = &table->Columns[column_n];
    if (!column->IsEnabled)
        return;
    column->CannotSkipItemsQueue = (1 << 0);
    table->AutoFitSingleColumn = (ImGuiTableColumnIdx)column_n;
}